

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

InvalidConstraint * __thiscall
slang::BumpAllocator::emplace<slang::ast::InvalidConstraint,slang::ast::Constraint_const*&>
          (BumpAllocator *this,Constraint **args)

{
  Constraint *pCVar1;
  InvalidConstraint *pIVar2;
  
  pIVar2 = (InvalidConstraint *)allocate(this,0x18,8);
  pCVar1 = *args;
  (pIVar2->super_Constraint).kind = Invalid;
  (pIVar2->super_Constraint).syntax = (ConstraintItemSyntax *)0x0;
  pIVar2->child = pCVar1;
  return pIVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }